

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void wasm::Literal::printDouble(ostream *o,double d)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  uint64_t uVar4;
  void *pvVar5;
  char *pcVar6;
  char *local_30;
  char *text;
  uint64_t payload;
  char *sign;
  double d_local;
  ostream *o_local;
  
  if (((d != 0.0) || (NAN(d))) || (bVar1 = std::signbit(d), !bVar1)) {
    uVar2 = std::isnan(d);
    if ((uVar2 & 1) == 0) {
      bVar1 = std::isfinite(d);
      if (bVar1) {
        local_30 = cashew::JSPrinter::numToString(d,true);
        if (*local_30 == '.') {
          std::operator<<(o,'0');
        }
        else if ((*local_30 == '-') && (local_30[1] == '.')) {
          std::operator<<(o,"-0");
          local_30 = local_30 + 1;
        }
        std::operator<<(o,local_30);
      }
      else {
        bVar1 = std::signbit(d);
        pcVar6 = "inf";
        if (bVar1) {
          pcVar6 = "-inf";
        }
        std::operator<<(o,pcVar6);
      }
    }
    else {
      bVar1 = std::signbit(d);
      pcVar6 = "";
      if (bVar1) {
        pcVar6 = "-";
      }
      poVar3 = std::operator<<(o,pcVar6);
      std::operator<<(poVar3,"nan");
      uVar4 = NaNPayload(d);
      if (uVar4 != 0) {
        poVar3 = std::operator<<(o,":0x");
        pvVar5 = (void *)std::ostream::operator<<(poVar3,std::hex);
        pvVar5 = (void *)std::ostream::operator<<(pvVar5,uVar4);
        std::ostream::operator<<(pvVar5,std::dec);
      }
    }
  }
  else {
    std::operator<<(o,"-0");
  }
  return;
}

Assistant:

void Literal::printDouble(std::ostream& o, double d) {
  if (d == 0 && std::signbit(d)) {
    o << "-0";
    return;
  }
  if (std::isnan(d)) {
    const char* sign = std::signbit(d) ? "-" : "";
    o << sign << "nan";
    if (uint64_t payload = NaNPayload(d)) {
      o << ":0x" << std::hex << payload << std::dec;
    }
    return;
  }
  if (!std::isfinite(d)) {
    o << (std::signbit(d) ? "-inf" : "inf");
    return;
  }
  const char* text = cashew::JSPrinter::numToString(d);
  // spec interpreter hates floats starting with '.'
  if (text[0] == '.') {
    o << '0';
  } else if (text[0] == '-' && text[1] == '.') {
    o << "-0";
    text++;
  }
  o << text;
}